

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Token * __thiscall toml::internal::Lexer::parseAsTime(Lexer *this,string *str)

{
  int iVar1;
  Token *in_RDI;
  double dVar2;
  int om;
  int oh;
  char pn;
  time_point tp;
  tm t;
  double ss;
  int mm;
  int hh;
  time_point tp_1;
  tm t_1;
  int DD;
  int MM;
  int YYYY;
  int n;
  char *s;
  duration *in_stack_fffffffffffffd48;
  allocator *paVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd50;
  TokenType type;
  Token *in_stack_fffffffffffffd58;
  time_point in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  TokenType TVar4;
  Token *in_stack_fffffffffffffd70;
  Token *this_00;
  duration<long,std::ratio<60l,1l>> local_268 [16];
  duration<long,std::ratio<3600l,1l>> local_258 [16];
  duration<long,std::ratio<60l,1l>> local_248 [16];
  duration<long,std::ratio<3600l,1l>> local_238 [23];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [36];
  int local_1d4;
  int local_1d0;
  char local_1c9;
  rep local_1c8;
  rep local_1c0;
  long local_1b8;
  duration<long,std::ratio<1l,1000000l>> local_1b0 [16];
  duration local_1a0;
  tm local_198;
  allocator local_159;
  string local_158 [32];
  double local_138;
  int local_12c;
  int local_128;
  allocator local_121;
  string local_120 [32];
  duration local_100;
  duration local_f8;
  tm local_f0;
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89 [56];
  allocator local_51;
  string local_50 [32];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  
  TVar4 = (TokenType)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_20 = std::__cxx11::string::c_str();
  iVar1 = __isoc99_sscanf(local_20,"%d-%d-%d%n",&local_28,&local_2c,&local_30,&local_24);
  if (iVar1 == 3) {
    if ((local_2c < 1) || (0xc < local_2c)) {
      this_00 = (Token *)local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_89 + 1),"Invalid token",(allocator *)this_00);
      Token::Token(this_00,TVar4,(string *)in_stack_fffffffffffffd60.__d.__r);
      std::__cxx11::string::~string((string *)(local_89 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_89);
    }
    else if (local_28 < 0x76c) {
      paVar3 = &local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"Invalid token",paVar3);
      Token::Token(in_stack_fffffffffffffd70,(TokenType)((ulong)paVar3 >> 0x20),
                   (string *)in_stack_fffffffffffffd60.__d.__r);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    else if (*(char *)(local_20 + local_24) == '\0') {
      local_f0.tm_sec = 0;
      local_f0.tm_min = 0;
      local_f0.tm_hour = 0;
      local_f0.tm_mday = local_30;
      local_f0.tm_mon = local_2c + -1;
      local_f0.tm_year = local_28 + -0x76c;
      timegm(&local_f0);
      TVar4 = (TokenType)((ulong)in_stack_fffffffffffffd50 >> 0x20);
      local_100.__r =
           (rep)std::chrono::_V2::system_clock::from_time_t((time_t)in_stack_fffffffffffffd58);
      local_f8.__r = local_100.__r;
      Token::Token(in_stack_fffffffffffffd58,TVar4,in_stack_fffffffffffffd60);
    }
    else if (*(char *)(local_20 + local_24) == 'T') {
      local_20 = local_20 + local_24 + 1;
      iVar1 = __isoc99_sscanf(local_20,"%d:%d:%lf%n",&local_128,&local_12c,&local_138,&local_24);
      if (iVar1 == 3) {
        local_198.tm_sec = (int)local_138;
        local_198.tm_min = local_12c;
        local_198.tm_hour = local_128;
        local_198.tm_mday = local_30;
        local_198.tm_mon = local_2c + -1;
        local_198.tm_year = local_28 + -0x76c;
        timegm(&local_198);
        local_1a0.__r =
             (rep)std::chrono::_V2::system_clock::from_time_t((time_t)in_stack_fffffffffffffd58);
        local_138 = local_138 - (double)(int)local_138;
        dVar2 = round(local_138 * 1000000.0);
        local_1b8 = (long)dVar2;
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,void>
                  (local_1b0,&local_1b8);
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::
        duration<long,std::ratio<1l,1000000l>,void>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd60.__d.__r
                   ,(duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffd58);
        std::chrono::
        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        type = (TokenType)((ulong)in_stack_fffffffffffffd50 >> 0x20);
        if (*(char *)(local_20 + local_24) == '\0') {
          local_1c0 = local_1a0.__r;
          Token::Token(in_stack_fffffffffffffd58,type,in_stack_fffffffffffffd60);
        }
        else if ((*(char *)(local_20 + local_24) == 'Z') &&
                (*(char *)(local_20 + (local_24 + 1)) == '\0')) {
          local_1c8 = local_1a0.__r;
          Token::Token(in_stack_fffffffffffffd58,type,in_stack_fffffffffffffd60);
        }
        else {
          local_20 = local_20 + local_24;
          iVar1 = __isoc99_sscanf(local_20,"%c%d:%d",&local_1c9,&local_1d0,&local_1d4);
          if (iVar1 == 3) {
            if ((local_1c9 == '+') || (local_1c9 == '-')) {
              if (local_1c9 == '+') {
                std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                          (local_238,&local_1d0);
                std::chrono::duration<long,std::ratio<1l,1000000000l>>::
                duration<long,std::ratio<3600l,1l>,void>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           in_stack_fffffffffffffd60.__d.__r,
                           (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffd58);
                std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::operator-=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
                std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                          (local_248,&local_1d4);
                std::chrono::duration<long,std::ratio<1l,1000000000l>>::
                duration<long,std::ratio<60l,1l>,void>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           in_stack_fffffffffffffd60.__d.__r,
                           (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffd58);
                std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::operator-=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
                TVar4 = (TokenType)((ulong)in_stack_fffffffffffffd50 >> 0x20);
              }
              else {
                std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                          (local_258,&local_1d0);
                std::chrono::duration<long,std::ratio<1l,1000000000l>>::
                duration<long,std::ratio<3600l,1l>,void>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           in_stack_fffffffffffffd60.__d.__r,
                           (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffd58);
                std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
                std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                          (local_268,&local_1d4);
                std::chrono::duration<long,std::ratio<1l,1000000000l>>::
                duration<long,std::ratio<60l,1l>,void>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           in_stack_fffffffffffffd60.__d.__r,
                           (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffd58);
                std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::operator+=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
                TVar4 = (TokenType)((ulong)in_stack_fffffffffffffd50 >> 0x20);
              }
              Token::Token(in_stack_fffffffffffffd58,TVar4,in_stack_fffffffffffffd60);
            }
            else {
              paVar3 = &local_221;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_220,"Invalid token",paVar3);
              Token::Token(in_stack_fffffffffffffd70,TVar4,
                           (string *)in_stack_fffffffffffffd60.__d.__r);
              std::__cxx11::string::~string(local_220);
              std::allocator<char>::~allocator((allocator<char> *)&local_221);
            }
          }
          else {
            paVar3 = &local_1f9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1f8,"Invalid token",paVar3);
            Token::Token(in_stack_fffffffffffffd70,TVar4,(string *)in_stack_fffffffffffffd60.__d.__r
                        );
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          }
        }
      }
      else {
        paVar3 = &local_159;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,"Invalid token",paVar3);
        Token::Token(in_stack_fffffffffffffd70,TVar4,(string *)in_stack_fffffffffffffd60.__d.__r);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
      }
    }
    else {
      paVar3 = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"Invalid token",paVar3);
      Token::Token(in_stack_fffffffffffffd70,TVar4,(string *)paVar3);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Invalid token",&local_51);
    Token::Token(in_stack_fffffffffffffd70,TVar4,(string *)in_stack_fffffffffffffd60.__d.__r);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return in_RDI;
}

Assistant:

inline Token Lexer::parseAsTime(const std::string& str)
{
    const char* s = str.c_str();

    int n;
    int YYYY, MM, DD;
#if defined(_MSC_VER)
    if (sscanf_s(s, "%d-%d-%d%n", &YYYY, &MM, &DD, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%d-%d-%d%n", &YYYY, &MM, &DD, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    if (!(1 <= MM && MM <= 12)) {
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
    }
    if (YYYY < 1900) {
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
    }

    if (s[n] == '\0') {
        std::tm t;
        t.tm_sec = 0;
        t.tm_min = 0;
        t.tm_hour = 0;
        t.tm_mday = DD;
        t.tm_mon = MM - 1;
        t.tm_year = YYYY - 1900;
        auto tp = std::chrono::system_clock::from_time_t(timegm(&t));
        return Token(TokenType::TIME, tp);
    }

    if (s[n] != 'T')
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));

    s = s + n + 1;

    int hh, mm;
    double ss; // double for fraction
#if defined(_MSC_VER)
    if (sscanf_s(s, "%d:%d:%lf%n", &hh, &mm, &ss, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%d:%d:%lf%n", &hh, &mm, &ss, &n) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    std::tm t;
    t.tm_sec = static_cast<int>(ss);
    t.tm_min = mm;
    t.tm_hour = hh;
    t.tm_mday = DD;
    t.tm_mon = MM - 1;
    t.tm_year = YYYY - 1900;
    auto tp = std::chrono::system_clock::from_time_t(timegm(&t));
    ss -= static_cast<int>(ss);
    // TODO(mayah): workaround GCC 4.9.3 on cygwin does not have std::round, but round().
    tp += std::chrono::microseconds(static_cast<std::int64_t>(round(ss * 1000000)));

    if (s[n] == '\0')
        return Token(TokenType::TIME, tp);

    if (s[n] == 'Z' && s[n + 1] == '\0')
        return Token(TokenType::TIME, tp);

    s = s + n;
    // offset
    // [+/-]%d:%d
    char pn;
    int oh, om;
#if defined(_MSC_VER)
    if (sscanf_s(s, "%c%d:%d", &pn, static_cast<unsigned>(sizeof(pn)), &oh, &om) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#else
    if (sscanf(s, "%c%d:%d", &pn, &oh, &om) != 3)
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));
#endif

    if (pn != '+' && pn != '-')
        return Token(TokenType::ERROR_TOKEN, std::string("Invalid token"));

    if (pn == '+') {
        tp -= std::chrono::hours(oh);
        tp -= std::chrono::minutes(om);
    } else {
        tp += std::chrono::hours(oh);
        tp += std::chrono::minutes(om);
    }

    return Token(TokenType::TIME, tp);
}